

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::a64::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  RABlockFlags *pRVar1;
  FuncValue *arg;
  undefined8 *puVar2;
  BaseBuilder *pBVar3;
  VirtReg *vReg;
  FuncNode *pFVar4;
  _func_int **pp_Var5;
  Error EVar6;
  BaseCompiler *pBVar7;
  RAWorkReg *o0;
  RAWorkReg *imm_;
  uint uVar8;
  uint uVar9;
  int *extraout_RDX;
  InvokeNode *pIVar10;
  InstId instId;
  InvokeNode *pIVar11;
  BaseRAPass *this_00;
  long lVar12;
  FuncValuePack *pFVar13;
  RAWorkReg *workReg;
  Operand_ OStack_78;
  RACFGBuilder *local_60;
  BaseReg local_58;
  BaseRAPass *local_48;
  InvokeNode *local_40;
  BaseRAPass *local_38;
  
  local_38 = (BaseRAPass *)(ulong)(invokeNode->_funcDetail)._argCount;
  pBVar7 = (this->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._cc;
  o0 = (RAWorkReg *)(invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
  (pBVar7->super_BaseBuilder)._cursor = (BaseNode *)o0;
  local_60 = this;
  if (local_38 != (BaseRAPass *)0x0) {
    pFVar13 = (invokeNode->_funcDetail)._args;
    pIVar10 = (InvokeNode *)0x0;
    this_00 = (BaseRAPass *)0x0;
    do {
      if (this_00 == (BaseRAPass *)0x10) {
LAB_00134ea3:
        OStack_78._data[0] = 0x134ea8;
        OStack_78._data[1] = 0;
        onBeforeInvoke();
        goto LAB_00134ea8;
      }
      lVar12 = 0;
      pIVar11 = pIVar10;
      local_48 = this_00;
      local_40 = pIVar10;
      do {
        uVar9 = *(uint *)((long)&pFVar13->_values[0]._data + lVar12);
        if (uVar9 == 0) break;
        if ((invokeNode->_funcDetail)._argCount <= (byte)this_00) {
          OStack_78._data[0] = 0x134e97;
          OStack_78._data[1] = 0;
          onBeforeInvoke();
          return 0x1e;
        }
        o0 = (RAWorkReg *)
             ((long)(pIVar11->super_InstNode)._opArray[0]._data +
             (long)(invokeNode->_args->_data + -4) + -8);
        if ((&o0->_workId)[lVar12] != 0) {
          arg = (FuncValue *)((long)&pFVar13->_values[0]._data + lVar12);
          imm_ = (RAWorkReg *)
                 ((long)(pIVar10->super_InstNode)._opArray[0]._data +
                 (long)(invokeNode->_args->_data + -4) + -8);
          uVar8 = (&o0->_workId)[lVar12] & 7;
          if (uVar8 == 3) {
            if ((uVar9 >> 8 & 1) == 0) {
              OStack_78._data[0] = 0x134ca2;
              OStack_78._data[1] = 0;
              EVar6 = moveImmToStackArg(local_60,pIVar11,arg,(Imm *)imm_);
joined_r0x00134cae:
              o0 = imm_;
              pIVar11 = local_40;
              this_00 = local_48;
              if (EVar6 != 0) {
                return EVar6;
              }
            }
            else {
              local_58.super_Operand.super_Operand_._0_8_ = (RAWorkReg *)0xff00000001;
              local_58.super_Operand.super_Operand_._data[0] = 0;
              local_58.super_Operand.super_Operand_._data[1] = 0;
              OStack_78._data[0] = 0x134cdb;
              OStack_78._data[1] = 0;
              EVar6 = moveImmToRegArg(local_60,pIVar11,arg,(Imm *)imm_,&local_58);
              if (EVar6 != 0) {
                return EVar6;
              }
              puVar2 = (undefined8 *)
                       ((long)(local_40->super_InstNode)._opArray[0]._data +
                       (long)(invokeNode->_args->_data[0]._data + lVar12 + -0x12 + -2));
              *puVar2 = local_58.super_Operand.super_Operand_._0_8_;
              *(uint32_t (*) [2])(puVar2 + 1) = local_58.super_Operand.super_Operand_._data;
              o0 = imm_;
              pIVar11 = local_40;
              this_00 = local_48;
            }
          }
          else if (uVar8 == 1) {
            this_00 = (local_60->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass;
            uVar8 = (&o0->_virtId)[lVar12] - 0x100;
            pBVar3 = (this_00->super_FuncPass).super_Pass._cb;
            if (*(uint *)&pBVar3[1].super_BaseEmitter._code <= uVar8) {
              return 0x1e;
            }
            pIVar11 = *(InvokeNode **)
                       (*(long *)&pBVar3[1].super_BaseEmitter._privateData + (ulong)uVar8 * 8);
            o0 = (RAWorkReg *)(pIVar11->super_InstNode).super_BaseNode._inlineComment;
            local_58.super_Operand.super_Operand_._0_8_ = o0;
            if (o0 == (RAWorkReg *)0x0) {
              OStack_78._data[0] = 0x134c59;
              OStack_78._data[1] = 0;
              EVar6 = BaseRAPass::_asWorkReg(this_00,(VirtReg *)pIVar11,(RAWorkReg **)&local_58);
              if (EVar6 != 0) {
                return EVar6;
              }
              uVar9 = arg->_data;
            }
            if ((uVar9 >> 8 & 1) == 0) {
              OStack_78._data[0] = 0x134c7f;
              OStack_78._data[1] = 0;
              EVar6 = moveRegToStackArg(local_60,pIVar11,arg,(BaseReg *)imm_);
              goto joined_r0x00134cae;
            }
            if (0x1fffffff < uVar9) {
              OStack_78._data[0] = 0x134ea3;
              OStack_78._data[1] = 0;
              onBeforeInvoke();
              goto LAB_00134ea3;
            }
            o0 = (RAWorkReg *)local_58.super_Operand.super_Operand_._0_8_;
            pIVar11 = local_40;
            this_00 = local_48;
            if (((*(uint *)(_archTraits + (ulong)(uVar9 >> 0x18) * 4 + 0x524) ^
                 ((OperandSignature *)(local_58.super_Operand.super_Operand_._0_8_ + 0x20))->_bits)
                & 0xf00) != 0) {
              return 0x19;
            }
          }
        }
        lVar12 = lVar12 + 4;
        pIVar10 = (InvokeNode *)&(pIVar10->super_InstNode).super_BaseNode.field_1;
      } while (lVar12 != 0x10);
      this_00 = (BaseRAPass *)((long)&(this_00->super_FuncPass).super_Pass._vptr_Pass + 1);
      pFVar13 = pFVar13 + 1;
      pIVar10 = (InvokeNode *)(pIVar11->super_InstNode)._opArray;
    } while (this_00 != local_38);
    pBVar7 = (local_60->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._cc;
  }
  (pBVar7->super_BaseBuilder)._cursor = (BaseNode *)invokeNode;
  if ((invokeNode->_funcDetail)._rets._values[0]._data != 0) {
    lVar12 = 0;
    do {
      uVar9 = *(uint *)((long)&(invokeNode->_funcDetail)._rets._values[0]._data + lVar12);
      if (uVar9 == 0) break;
      if (((invokeNode->_rets)._data[0]._data[lVar12 + -2] & 7) == 1) {
        this_00 = (local_60->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass;
        uVar8 = (invokeNode->_rets)._data[0]._data[lVar12 + -1] - 0x100;
        pBVar3 = (this_00->super_FuncPass).super_Pass._cb;
        if (*(uint *)&pBVar3[1].super_BaseEmitter._code <= uVar8) {
          return 0x1e;
        }
        vReg = *(VirtReg **)(*(long *)&pBVar3[1].super_BaseEmitter._privateData + (ulong)uVar8 * 8);
        o0 = vReg->_workReg;
        local_58.super_Operand.super_Operand_._0_8_ = o0;
        if (o0 == (RAWorkReg *)0x0) {
          OStack_78._data[0] = 0x134df9;
          OStack_78._data[1] = 0;
          EVar6 = BaseRAPass::_asWorkReg(this_00,vReg,(RAWorkReg **)&local_58);
          if (EVar6 != 0) {
            return EVar6;
          }
          uVar9 = *(uint *)((long)&(invokeNode->_funcDetail)._rets._values[0]._data + lVar12);
        }
        if ((uVar9 >> 8 & 1) != 0) {
          if (0x1fffffff < uVar9) {
LAB_00134ea8:
            OStack_78._data[0] = 0x134ead;
            OStack_78._data[1] = 0;
            onBeforeInvoke();
            pp_Var5 = (this_00->super_FuncPass).super_Pass._vptr_Pass;
            OStack_78._baseId = *(uint32_t *)((long)pp_Var5 + 0x1dc);
            OStack_78._signature._bits = *(uint *)(pp_Var5 + 0x3b) & 0xf8 | 2;
            OStack_78._data = (uint32_t  [2])((ulong)(uint)(*extraout_RDX >> 0xc) << 0x20);
            uVar9 = o0->_workId & 0xf00;
            if (uVar9 == 0) {
              instId = 0x145;
            }
            else {
              if (uVar9 != 0x100) {
                return 3;
              }
              instId = 0x2ab;
            }
            EVar6 = BaseEmitter::_emitI(&((this_00->super_FuncPass).super_Pass._cb)->
                                         super_BaseEmitter,instId,(Operand_ *)o0,&OStack_78);
            return EVar6;
          }
          if (((*(uint *)(_archTraits + (ulong)(uVar9 >> 0x18) * 4 + 0x524) ^
               ((OperandSignature *)(local_58.super_Operand.super_Operand_._0_8_ + 0x20))->_bits) &
              0xf00) != 0) {
            return 0x19;
          }
        }
      }
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x10);
  }
  pRVar1 = &((local_60->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock)->
            _flags;
  *pRVar1 = *pRVar1 | kHasFuncCalls;
  pFVar4 = ((local_60->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass)->_func;
  (pFVar4->_frame)._attributes = (pFVar4->_frame)._attributes | kHasFuncCalls;
  uVar9 = (invokeNode->_funcDetail)._argStackSize;
  uVar8 = (pFVar4->_frame)._callStackSize;
  if (uVar9 < uVar8) {
    uVar9 = uVar8;
  }
  (pFVar4->_frame)._callStackSize = uVar9;
  return 0;
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup != argGroup) {
            // TODO: [ARM] Conversion is not supported.
            return DebugUtils::errored(kErrorInvalidAssignment);
          }
        }
        else {
          ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup retGroup = Reg::groupOf(ret.regType());

          if (regGroup != retGroup) {
            // TODO: [ARM] Conversion is not supported.
            return DebugUtils::errored(kErrorInvalidAssignment);
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlockFlags::kHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncAttributes::kHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}